

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryDirectory::replaceFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  ArrayDisposer **ppAVar1;
  undefined8 *puVar2;
  long lVar3;
  _func_int *p_Var4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  AtomicRefcounted *refcounted;
  _func_int **pp_Var8;
  undefined4 in_register_0000000c;
  long lVar9;
  undefined8 *puVar10;
  char *pcVar11;
  Replacer<kj::File> *extraout_RDX;
  Replacer<kj::File> *extraout_RDX_00;
  Replacer<kj::File> *extraout_RDX_01;
  Replacer<kj::File> *extraout_RDX_02;
  Replacer<kj::File> *pRVar12;
  undefined4 in_R8D;
  Directory *ptrCopy;
  Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> OVar13;
  StringPtr name;
  Fault f;
  undefined1 local_48 [24];
  
  lVar9 = CONCAT44(in_register_0000000c,mode);
  puVar10 = (undefined8 *)path.parts.size_;
  name.content.ptr = path.parts.ptr;
  if (lVar9 == 1) {
    puVar2 = (undefined8 *)name.content.ptr[2].content.size_;
    (**(code **)*puVar2)(local_48,puVar2,name.content.ptr[2].content.ptr);
    pp_Var8 = (_func_int **)operator_new(0x48);
    uVar6 = local_48._8_8_;
    lVar9 = puVar10[1];
    if (lVar9 == 0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (char *)*puVar10;
    }
    p_Var4 = (_func_int *)CONCAT44(local_48._4_4_,local_48._0_4_);
    local_48._8_8_ = (_func_int **)0x0;
    *(undefined4 *)(pp_Var8 + 1) = in_R8D;
    *pp_Var8 = (_func_int *)&PTR_get_0070ffb0;
    *(undefined1 *)((long)pp_Var8 + 0xc) = 0;
    LOCK();
    ppAVar1 = &((name.content.ptr)->content).disposer;
    *(int *)ppAVar1 = *(int *)ppAVar1 + 1;
    UNLOCK();
    pp_Var8[2] = (_func_int *)&((name.content.ptr)->content).size_;
    pp_Var8[3] = (_func_int *)name.content.ptr;
    heapString((String *)(pp_Var8 + 4),pcVar11,lVar9 + -1 + (ulong)(lVar9 == 0));
    pp_Var8[7] = p_Var4;
    pp_Var8[8] = (_func_int *)uVar6;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>>
          ::instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var8;
    pRVar12 = extraout_RDX_01;
  }
  else {
    if (lVar9 == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x48b,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      kj::_::Debug::Fault::~Fault((Fault *)local_48);
    }
    else {
      lVar3 = puVar10[1];
      if (lVar3 == 0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (char *)*puVar10;
      }
      name.content.size_ = (size_t)pcVar11;
      tryGetParent((InMemoryDirectory *)local_48,name,(int)lVar3 + (uint)(lVar3 == 0));
      local_48._16_8_ = CONCAT44(local_48._4_4_,local_48._0_4_);
      if ((_func_int **)local_48._8_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_48._8_8_ + 0x70))
                  (this,local_48._8_8_,puVar10 + 3,lVar9 + -1,in_R8D);
        (*(code *)**(undefined8 **)local_48._16_8_)
                  (local_48._16_8_,
                   (_func_int *)(*(long *)(*(_func_int **)local_48._8_8_ + -0x10) + local_48._8_8_))
        ;
        pRVar12 = extraout_RDX;
        goto LAB_004eb968;
      }
    }
    puVar10 = (undefined8 *)name.content.ptr[2].content.size_;
    (**(code **)*puVar10)(local_48,puVar10,name.content.ptr[2].content.ptr);
    pp_Var8 = (_func_int **)operator_new(0x20);
    uVar5 = local_48._8_4_;
    uVar7 = local_48._12_4_;
    local_48._8_8_ = (_func_int **)0x0;
    *(undefined4 *)(pp_Var8 + 1) = 3;
    *pp_Var8 = (_func_int *)&PTR_get_00710020;
    *(undefined4 *)(pp_Var8 + 2) = local_48._0_4_;
    *(undefined4 *)((long)pp_Var8 + 0x14) = local_48._4_4_;
    *(undefined4 *)(pp_Var8 + 3) = uVar5;
    *(undefined4 *)((long)pp_Var8 + 0x1c) = uVar7;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::
          HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var8;
    pRVar12 = extraout_RDX_00;
  }
  uVar6 = local_48._8_8_;
  if ((_func_int **)local_48._8_8_ != (_func_int **)0x0) {
    local_48._8_8_ = (_func_int **)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_48._4_4_,local_48._0_4_))
              ((undefined8 *)CONCAT44(local_48._4_4_,local_48._0_4_),
               uVar6 + *(long *)(*(_func_int **)uVar6 + -0x10));
    pRVar12 = extraout_RDX_02;
  }
LAB_004eb968:
  OVar13.ptr = pRVar12;
  OVar13.disposer = (Disposer *)this;
  return OVar13;
}

Assistant:

Own<Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
    } else if (path.size() == 1) {
      // don't need lock just to construct a file
      return heap<ReplacerImpl<File>>(*this, path[0],
          impl.getWithoutLock().newFile(), mode);
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], mode)) {
        return child->replaceFile(path.slice(1, path.size()), mode);
      }
    }
    return heap<BrokenReplacer<File>>(impl.getWithoutLock().newFile());
  }